

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

char __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::FractionalDigitGenerator::GetOneDigit
          (FractionalDigitGenerator *this)

{
  reference puVar1;
  size_t local_28;
  size_t i;
  char carry;
  FractionalDigitGenerator *this_local;
  
  if (this->after_chunk_index_ == 0) {
    this_local._7_1_ = '\0';
  }
  else {
    i._7_1_ = '\0';
    for (local_28 = this->after_chunk_index_; local_28 != 0; local_28 = local_28 - 1) {
      puVar1 = Span<unsigned_int>::operator[](&this->data_,local_28 - 1);
      i._7_1_ = MultiplyBy10WithCarry<unsigned_int>(puVar1,i._7_1_);
    }
    puVar1 = Span<unsigned_int>::operator[](&this->data_,this->after_chunk_index_ - 1);
    if (*puVar1 == 0) {
      this->after_chunk_index_ = this->after_chunk_index_ - 1;
    }
    this_local._7_1_ = i._7_1_;
  }
  return this_local._7_1_;
}

Assistant:

char GetOneDigit() {
    if (!after_chunk_index_)
      return 0;

    char carry = 0;
    for (size_t i = after_chunk_index_; i > 0; --i) {
      carry = MultiplyBy10WithCarry(&data_[i - 1], carry);
    }
    // If the lowest chunk is now empty, remove it from view.
    if (data_[after_chunk_index_ - 1] == 0)
      --after_chunk_index_;
    return carry;
  }